

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O2

int bv_put_bits(bv_t *bv,unsigned_long bits,uint numbits)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  char cVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  char *__assertion;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  
  if (bv == (bv_t *)0x0) {
    __assertion = "bv != NULL";
    uVar2 = 0x7e;
  }
  else {
    puVar3 = bv->data;
    if (puVar3 != (uchar *)0x0) {
      uVar2 = bv->idx;
      if (uVar2 < bv->len) {
        iVar5 = 0;
        if (numbits <= bv->len - uVar2) {
          uVar11 = uVar2 & 7;
          bv->idx = uVar2 + numbits;
          cVar4 = (char)numbits;
          uVar9 = bits << (-(cVar4 + ' ') & 0x3fU);
          pbVar13 = puVar3 + (uVar2 >> 3);
          bVar6 = (byte)(8 - uVar11);
          bVar8 = (puVar3[uVar2 >> 3] >> (bVar6 & 0x1f)) << (bVar6 & 0x1f);
          uVar1 = uVar11 + numbits;
          uVar12 = uVar9 >> 0x18 & 0xff;
          if (uVar1 < 8) {
            bVar10 = 0;
            if (8 - uVar11 != numbits) {
              bVar10 = (char)(2 << ((bVar6 - cVar4) - 1 & 0x1f)) - 1U & puVar3[uVar2 >> 3];
            }
            bVar8 = (byte)((uVar12 >> (8U - cVar4 & 0x3f)) << (bVar6 - cVar4 & 0x3f)) | bVar8;
          }
          else {
            uVar7 = 1;
            *pbVar13 = bVar8 | (byte)(uVar12 >> (sbyte)uVar11);
            uVar9 = uVar9 << (bVar6 & 0x3f);
            uVar12 = (ulong)(uVar2 >> 3);
            while( true ) {
              uVar12 = uVar12 + 1;
              if (uVar1 >> 3 <= uVar7) break;
              bv->data[uVar12] = (uchar)(uVar9 >> 0x18);
              uVar7 = uVar7 + 1;
              uVar9 = uVar9 << 8;
            }
            bVar8 = (byte)uVar1 & 7;
            bVar6 = 8 - bVar8;
            pbVar13 = bv->data + uVar12;
            bVar10 = (char)(2 << (bVar8 ^ 7)) - 1U & bv->data[uVar12];
            bVar8 = (byte)(((uVar9 >> 0x18) >> (bVar6 & 0x3f)) << (bVar6 & 0x3f));
          }
          *pbVar13 = bVar8 | bVar10;
          iVar5 = 1;
        }
        return iVar5;
      }
      __assert_fail("bv->len > bv->idx",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x80,
                    "int bv_put_bits(bv_t *, unsigned long, unsigned int)");
    }
    __assertion = "bv->data != NULL";
    uVar2 = 0x7f;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                uVar2,"int bv_put_bits(bv_t *, unsigned long, unsigned int)");
}

Assistant:

int bv_put_bits(bv_t *bv, unsigned long bits, unsigned int numbits) {
  assert(bv != NULL);
  assert(bv->data != NULL);
  assert(bv->len > bv->idx);
  assert((numbits <= 32) ||
         "Can not write more than 32 bits into a bit vector");

  if (numbits > (bv->len - bv->idx))
    return 0;

  unsigned int cidx = bv->idx >> 3;
  unsigned int overflow = bv->idx & 0x07;

  bv->idx += numbits;
  /*M
    Put first bit as highest order bit of 32 bit long.
  **/
  bits <<= (32 - numbits);

  if ((overflow + numbits) < 8) {
    bv->data[cidx] =
      (HIGHERBITS(bv->data[cidx], overflow) << (8 - overflow)) |
      (HIGHERBITS(bits >> 24, numbits) << (8 - overflow - numbits)) |
      LOWERBITS(bv->data[cidx], 8 - overflow - numbits);
    return 1;
  } else {
    bv->data[cidx] =
      (HIGHERBITS(bv->data[cidx], overflow) << (8 - overflow)) |
      HIGHERBITS(bits >> 24, 8 - overflow);
  }
  cidx++;
  bits <<= 8 - overflow;

  unsigned int len = ((numbits + overflow) >> 3) + 1;
  unsigned int i;
  for (i = 1; i < len - 1; i++, bits <<= 8)
    bv->data[cidx++] = (bits >> 24) & 0xff;

  unsigned int lastbits = (overflow + numbits) & 0x07;
  bv->data[cidx] =
    (HIGHERBITS((bits >> 24) & 0xff, lastbits) << (8 - lastbits)) |
    LOWERBITS(bv->data[cidx], 8 - lastbits);

  return 1;
}